

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_15::BinaryReaderIR::SetBlockDeclaration
          (BinaryReaderIR *this,BlockDeclaration *decl,Type sig_type)

{
  char *__s;
  Offset OVar1;
  pointer pTVar2;
  Index type_index;
  Location loc;
  Type local_a0;
  Location local_98;
  Var local_70;
  
  local_a0 = sig_type;
  if (sig_type.enum_ < Any) {
    decl->has_func_type = false;
    pTVar2 = (decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_finish != pTVar2) {
      (decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_finish = pTVar2;
    }
    Type::GetInlineVector((TypeVector *)&local_98,&local_a0);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::_M_move_assign
              (&(decl->sig).result_types,&local_98);
    if ((void *)local_98.filename._M_len != (void *)0x0) {
      operator_delete((void *)local_98.filename._M_len,
                      CONCAT44(local_98.field_1.field_0.first_column,local_98.field_1.field_0.line)
                      - local_98.filename._M_len);
    }
  }
  else {
    local_98.field_1.field_0.line = 0;
    local_98.field_1.field_0.first_column = 0;
    local_98.field_1.field_0.last_column = 0;
    local_98.filename._M_len = 0;
    local_98.filename._M_str._0_4_ = 0;
    local_98.filename._M_str._4_4_ = 0;
    __s = this->filename_;
    local_98.filename._M_len = strlen(__s);
    local_98.filename._M_str._0_4_ = SUB84(__s,0);
    local_98.filename._M_str._4_4_ = (undefined4)((ulong)__s >> 0x20);
    OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
    local_98.field_1.field_0.line = (int)OVar1;
    local_98.field_1.field_0.first_column = (int)(OVar1 >> 0x20);
    Var::Var(&local_70,sig_type.enum_,&local_98);
    SetFuncDeclaration(this,decl,&local_70);
    Var::~Var(&local_70);
  }
  return;
}

Assistant:

void BinaryReaderIR::SetBlockDeclaration(BlockDeclaration* decl,
                                         Type sig_type) {
  if (sig_type.IsIndex()) {
    Index type_index = sig_type.GetIndex();
    SetFuncDeclaration(decl, Var(type_index, GetLocation()));
  } else {
    decl->has_func_type = false;
    decl->sig.param_types.clear();
    decl->sig.result_types = sig_type.GetInlineVector();
  }
}